

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O3

void icu_63::number::impl::blueprint_helpers::parseIncrementOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *status)

{
  FractionSignificantSettings FVar1;
  char16_t cVar2;
  int32_t iVar3;
  PrecisionType PVar4;
  int iVar5;
  StringPiece n;
  UErrorCode localStatus;
  UErrorCode conversionStatus;
  DecimalQuantity dq;
  CharString buffer;
  ConstChar16Ptr local_140;
  UErrorCode local_134;
  double local_130;
  char16_t *local_128;
  UnicodeString local_118;
  IncrementPrecision local_d8;
  DecimalQuantity local_b8;
  CharString local_68;
  
  MaybeStackArray<char,_40>::MaybeStackArray(&local_68.buffer);
  local_68.len = 0;
  *local_68.buffer.ptr = '\0';
  local_d8.super_Precision.fType = RND_BOGUS;
  numparse::impl::StringSegment::toTempUnicodeString(&local_118,segment);
  if ((local_118.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
    if ((local_118.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
      local_140.p_ = (char16_t *)CONCAT44(local_118.fUnion._20_4_,local_118.fUnion._16_4_);
    }
    else {
      local_140.p_ = (char16_t *)((long)&local_118.fUnion + 2);
    }
  }
  else {
    local_140.p_ = (char16_t *)0x0;
  }
  iVar3 = numparse::impl::StringSegment::length(segment);
  UnicodeString::UnicodeString((UnicodeString *)&local_b8,'\0',&local_140,iVar3);
  CharString::appendInvariantChars(&local_68,(UnicodeString *)&local_b8,(UErrorCode *)&local_d8);
  UnicodeString::~UnicodeString((UnicodeString *)&local_b8);
  local_128 = local_140.p_;
  UnicodeString::~UnicodeString(&local_118);
  PVar4 = 0x10113;
  if ((local_d8.super_Precision.fType == 0x1a) ||
     (PVar4 = local_d8.super_Precision.fType, U_ZERO_ERROR < (int)local_d8.super_Precision.fType)) {
    *status = PVar4;
  }
  else {
    DecimalQuantity::DecimalQuantity(&local_b8);
    local_134 = U_ZERO_ERROR;
    n.length_ = local_68.len;
    n.ptr_ = local_68.buffer.ptr;
    n._12_4_ = 0;
    DecimalQuantity::setToDecNumber(&local_b8,n,&local_134);
    if (local_134 < U_ILLEGAL_ARGUMENT_ERROR) {
      local_130 = DecimalQuantity::toDouble(&local_b8);
      iVar5 = 1;
      while( true ) {
        iVar3 = numparse::impl::StringSegment::length(segment);
        if (iVar3 <= iVar5 + -1) break;
        cVar2 = numparse::impl::StringSegment::charAt(segment,iVar5 + -1);
        if (cVar2 == L'.') break;
        iVar5 = iVar5 + 1;
      }
      iVar3 = numparse::impl::StringSegment::length(segment);
      if (iVar5 - iVar3 == 1) {
        Precision::increment((IncrementPrecision *)&local_118,local_130);
      }
      else {
        iVar3 = numparse::impl::StringSegment::length(segment);
        Precision::increment(&local_d8,local_130);
        IncrementPrecision::withMinFraction((Precision *)&local_118,&local_d8,iVar3 - iVar5);
      }
      FVar1.fMaxFrac = local_118.fUnion.fStackFields.fBuffer[0];
      FVar1.fMinFrac = local_118.fUnion.fStackFields.fLengthAndFlags;
      FVar1.fMinSig = local_118.fUnion.fStackFields.fBuffer[1];
      FVar1.fMaxSig = local_118.fUnion.fStackFields.fBuffer[2];
      *(ulong *)((long)&(macros->precision).fUnion.increment.fIncrement + 4) =
           CONCAT44(local_118.fUnion.fFields.fCapacity,local_118.fUnion.fFields.fLength);
      *(ulong *)((long)&(macros->precision).fUnion + 0xc) =
           CONCAT44(local_118.fUnion._16_4_,local_118.fUnion._12_4_);
      *(UObject *)&macros->precision = local_118.super_Replaceable.super_UObject._vptr_UObject;
      (macros->precision).fUnion.fracSig = FVar1;
    }
    else {
      *status = U_NUMBER_SKELETON_SYNTAX_ERROR;
    }
    DecimalQuantity::~DecimalQuantity(&local_b8);
  }
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_68.buffer);
  return;
}

Assistant:

void blueprint_helpers::parseIncrementOption(const StringSegment& segment, MacroProps& macros,
                                             UErrorCode& status) {
    // Need to do char <-> UChar conversion...
    U_ASSERT(U_SUCCESS(status));
    CharString buffer;
    SKELETON_UCHAR_TO_CHAR(buffer, segment.toTempUnicodeString(), 0, segment.length(), status);

    // Utilize DecimalQuantity/decNumber to parse this for us.
    DecimalQuantity dq;
    UErrorCode localStatus = U_ZERO_ERROR;
    dq.setToDecNumber({buffer.data(), buffer.length()}, localStatus);
    if (U_FAILURE(localStatus)) {
        // throw new SkeletonSyntaxException("Invalid rounding increment", segment, e);
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return;
    }
    double increment = dq.toDouble();

    // We also need to figure out how many digits. Do a brute force string operation.
    int decimalOffset = 0;
    while (decimalOffset < segment.length() && segment.charAt(decimalOffset) != '.') {
        decimalOffset++;
    }
    if (decimalOffset == segment.length()) {
        macros.precision = Precision::increment(increment);
    } else {
        int32_t fractionLength = segment.length() - decimalOffset - 1;
        macros.precision = Precision::increment(increment).withMinFraction(fractionLength);
    }
}